

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typeinfo.cpp
# Opt level: O0

NULLCRef * NULLCTypeInfo::GetPointerTarget(NULLCRef obj)

{
  ExternTypeInfo *pEVar1;
  anon_union_4_2_4d8b2ff0_for_ExternTypeInfo_14 *in_RDI;
  uint in_stack_00000008;
  undefined4 in_stack_0000000c;
  ExternTypeInfo *type;
  
  if (linker != 0) {
    pEVar1 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                       ((FastVector<ExternTypeInfo,_false,_false> *)(linker + 0x200),
                        in_stack_00000008);
    if (pEVar1->subCat == CAT_POINTER) {
      *(undefined8 *)(in_RDI + 1) = *(undefined8 *)CONCAT124(obj,in_stack_0000000c);
      *in_RDI = pEVar1->field_11;
    }
    else {
      FastVector<char,_false,_false>::operator[]
                ((FastVector<char,_false,_false> *)(linker + 0x290),pEVar1->offsetToName);
      nullcThrowError("pointerGetTarget: \'%s\' is not a pointer");
      memset(in_RDI,0,0xc);
    }
    return (NULLCRef *)in_RDI;
  }
  __assert_fail("linker",
                "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/includes/typeinfo.cpp"
                ,0x6b,"NULLCRef NULLCTypeInfo::GetPointerTarget(NULLCRef)");
}

Assistant:

NULLCRef GetPointerTarget(NULLCRef obj)
	{
		assert(linker);

		ExternTypeInfo &type = linker->exTypes[obj.typeID];

		if(type.subCat != ExternTypeInfo::CAT_POINTER)
		{
			nullcThrowError("pointerGetTarget: '%s' is not a pointer", &linker->exSymbols[type.offsetToName]);

			NULLCRef r = { 0, 0 };
			return r;
		}

		NULLCRef r;
		r.ptr = *(char**)obj.ptr;
		r.typeID = type.subType;
		return r;
	}